

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

CK_VOID_PTR __thiscall HandleManager::getSession(HandleManager *this,CK_SESSION_HANDLE hSession)

{
  iterator iVar1;
  CK_VOID_PTR pvVar2;
  MutexLocker lock;
  MutexLocker MStack_28;
  CK_SESSION_HANDLE local_18;
  
  local_18 = hSession;
  MutexLocker::MutexLocker(&MStack_28,this->handlesMutex);
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Handle>,_std::_Select1st<std::pair<const_unsigned_long,_Handle>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
          ::find(&(this->handles)._M_t,&local_18);
  if (((_Rb_tree_header *)iVar1._M_node == &(this->handles)._M_t._M_impl.super__Rb_tree_header) ||
     (iVar1._M_node[1]._M_parent != (_Base_ptr)0x1)) {
    pvVar2 = (CK_VOID_PTR)0x0;
  }
  else {
    pvVar2 = *(CK_VOID_PTR *)(iVar1._M_node + 2);
  }
  MutexLocker::~MutexLocker(&MStack_28);
  return pvVar2;
}

Assistant:

CK_VOID_PTR HandleManager::getSession(const CK_SESSION_HANDLE hSession)
{
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hSession);
	if (it == handles.end() || CKH_SESSION != it->second.kind)
		return NULL_PTR;
	return it->second.object;
}